

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

bool rcg::anon_unknown_5::getBufferBool
               (shared_ptr<const_rcg::GenTLWrapper> *gentl,void *stream,void *buffer,
               BUFFER_INFO_CMD cmd)

{
  element_type *peVar1;
  BUFFER_INFO_CMD in_ECX;
  BUFFER_HANDLE in_RDX;
  DS_HANDLE in_RSI;
  size_t size;
  INFO_DATATYPE type;
  bool8_t ret;
  size_t local_30;
  INFO_DATATYPE local_24;
  byte local_1d;
  BUFFER_INFO_CMD local_1c;
  BUFFER_HANDLE local_18;
  DS_HANDLE local_10;
  
  local_1d = 0;
  local_30 = 1;
  if ((in_RSI != (DS_HANDLE)0x0) && (in_RDX != (BUFFER_HANDLE)0x0)) {
    local_1c = in_ECX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1278cf);
    (*peVar1->DSGetBufferInfo)(local_10,local_18,local_1c,&local_24,&local_1d,&local_30);
  }
  return (local_1d & 1) != 0;
}

Assistant:

inline bool getBufferBool(const std::shared_ptr<const GenTLWrapper> &gentl,
                          void *stream, void *buffer, GenTL::BUFFER_INFO_CMD cmd)
{
  bool8_t ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(ret);

  if (stream != 0 && buffer != 0)
  {
    gentl->DSGetBufferInfo(stream, buffer, cmd, &type, &ret, &size);
  }

  return ret != 0;
}